

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_set_compression_strategy(png_structrp png_ptr,int strategy)

{
  int strategy_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->flags = png_ptr->flags | 1;
    png_ptr->zlib_strategy = strategy;
  }
  return;
}

Assistant:

void PNGAPI
png_set_compression_strategy(png_structrp png_ptr, int strategy)
{
   png_debug(1, "in png_set_compression_strategy");

   if (png_ptr == NULL)
      return;

   /* The flag setting here prevents the libpng dynamic selection of strategy.
    */
   png_ptr->flags |= PNG_FLAG_ZLIB_CUSTOM_STRATEGY;
   png_ptr->zlib_strategy = strategy;
}